

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdBool32x4OperationX86X64.cpp
# Opt level: O3

bool Js::SIMDBool32x4Operation::OpAllTrue<char>(SIMDValue *simd)

{
  undefined1 auVar1 [16];
  
  auVar1[0] = -((simd->field_0).i8[0] == '\0');
  auVar1[1] = -((simd->field_0).i8[1] == '\0');
  auVar1[2] = -((simd->field_0).i8[2] == '\0');
  auVar1[3] = -((simd->field_0).i8[3] == '\0');
  auVar1[4] = -((simd->field_0).i8[4] == '\0');
  auVar1[5] = -((simd->field_0).i8[5] == '\0');
  auVar1[6] = -((simd->field_0).i8[6] == '\0');
  auVar1[7] = -((simd->field_0).i8[7] == '\0');
  auVar1[8] = -((simd->field_0).i8[8] == '\0');
  auVar1[9] = -((simd->field_0).i8[9] == '\0');
  auVar1[10] = -((simd->field_0).i8[10] == '\0');
  auVar1[0xb] = -((simd->field_0).i8[0xb] == '\0');
  auVar1[0xc] = -((simd->field_0).i8[0xc] == '\0');
  auVar1[0xd] = -((simd->field_0).i8[0xd] == '\0');
  auVar1[0xe] = -((simd->field_0).i8[0xe] == '\0');
  auVar1[0xf] = -((simd->field_0).i8[0xf] == '\0');
  return (((((((((((((((auVar1 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar1 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar1 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar1 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar1 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar1 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar1 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar1 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar1 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar1 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar1 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar1 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar1 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar1 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar1 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar1[0xf];
}

Assistant:

bool SIMDBool32x4Operation::OpAllTrue(const SIMDValue& simd)
    {
        SIMDValue canonSimd = SIMDUtils::CanonicalizeToBools<T>(simd); //copy-by-value since we need to modify the copy
        X86SIMDValue x86Simd = X86SIMDValue::ToX86SIMDValue(canonSimd);
        int mask_8 = _mm_movemask_epi8(x86Simd.m128i_value); //latency 3, throughput 1
        return mask_8 == 0xFFFF;
    }